

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::logBlendState(TestLog *log,BlendState *blend)

{
  ostringstream *poVar1;
  bool *pbVar2;
  Vector<bool,_4> *v;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar3;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar4;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *blendEq;
  BVec4 mask;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  pbVar2 = (blend->enableBlend).m_ptr;
  if (pbVar2 != (bool *)0x0) {
    if (*pbVar2 == true) {
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::operator<<((ostream *)(local_1a8 + 8),"Enable blending.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::operator<<((ostream *)(local_1a8 + 8),"Disable blending.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  }
  v = (blend->colorMask).m_ptr;
  if (v != (Vector<bool,_4> *)0x0) {
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&local_1c8,v);
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Set color mask: ");
    tcu::operator<<((ostream *)poVar1,(Vector<bool,_4> *)&local_1c8);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  pEVar3 = (blend->blendEq).m_ptr;
  if (pEVar3 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    if (pEVar3->m_isFirst == true) {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Set blend equation: ");
      local_1c8.m_value = *(pEVar3->field_1).m_first;
      local_1c8.m_getName = glu::getBlendEquationName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Set blend equation rgb: ");
      local_1c8.m_value = *(pEVar3->field_1).m_first;
      local_1c8.m_getName = glu::getBlendEquationName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,", alpha: ");
      local_1b8.m_value = ((pEVar3->field_1).m_second)->alpha;
      local_1b8.m_getName = glu::getBlendEquationName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  }
  pEVar4 = (blend->blendFunc).m_ptr;
  if (pEVar4 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    if (pEVar4->m_isFirst == true) {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Set blend function source: ");
      local_1c8.m_value = ((pEVar4->field_1).m_first)->src;
      local_1c8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,", destination: ");
      local_1b8.m_value = ((pEVar4->field_1).m_first)->dst;
      local_1b8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Set blend function rgb source: ");
      local_1c8.m_value = ((pEVar4->field_1).m_first)->src;
      local_1c8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,", destination: ");
      local_1b8.m_value = ((pEVar4->field_1).m_first)->dst;
      local_1b8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      poVar1 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Set blend function alpha source: ");
      local_1c8.m_value = (((pEVar4->field_1).m_second)->alpha).src;
      local_1c8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,", destination: ");
      local_1b8.m_value = (((pEVar4->field_1).m_second)->alpha).dst;
      local_1b8.m_getName = glu::getBlendFactorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  }
  return;
}

Assistant:

void logBlendState (TestLog&			log,
					const BlendState&	blend)
{
	if (blend.enableBlend)
	{
		if (*blend.enableBlend)
			log << TestLog::Message << "Enable blending." << TestLog::EndMessage;
		else
			log << TestLog::Message << "Disable blending." << TestLog::EndMessage;
	}

	if (blend.colorMask)
	{
		const BVec4 mask = *blend.colorMask;

		log << TestLog::Message << "Set color mask: " << mask << "." << TestLog::EndMessage;
	}

	if (blend.blendEq)
	{
		const Either<BlendEq, SeparateBlendEq>& blendEq = *blend.blendEq;

		if (blendEq.is<BlendEq>())
			log << TestLog::Message << "Set blend equation: " << glu::getBlendEquationStr(blendEq.get<BlendEq>()) << "." << TestLog::EndMessage;
		else if (blendEq.is<SeparateBlendEq>())
			log << TestLog::Message << "Set blend equation rgb: " << glu::getBlendEquationStr(blendEq.get<SeparateBlendEq>().rgb) << ", alpha: " << glu::getBlendEquationStr(blendEq.get<SeparateBlendEq>().alpha) << "." << TestLog::EndMessage;
		else
			DE_ASSERT(false);
	}

	if (blend.blendFunc)
	{
		const Either<BlendFunc, SeparateBlendFunc>& blendFunc = *blend.blendFunc;

		if (blendFunc.is<BlendFunc>())
			log << TestLog::Message << "Set blend function source: " << glu::getBlendFactorStr(blendFunc.get<BlendFunc>().src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<BlendFunc>().dst) << "." << TestLog::EndMessage;
		else if (blendFunc.is<SeparateBlendFunc>())
		{
			log << TestLog::Message << "Set blend function rgb source: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().rgb.src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().rgb.dst) << "." << TestLog::EndMessage;
			log << TestLog::Message << "Set blend function alpha source: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().alpha.src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().alpha.dst) << "." << TestLog::EndMessage;
		}
		else
			DE_ASSERT(false);
	}
}